

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O3

ON_BrepFace * __thiscall ON_BrepFace::operator=(ON_BrepFace *this,ON_BrepFace *src)

{
  element_type *peVar1;
  Impl *pIVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined8 uVar4;
  unsigned_short uVar5;
  unsigned_short uVar6;
  int iVar7;
  ON_Mesh *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  recursive_mutex *__mutex;
  recursive_mutex *__mutex_00;
  
  if (src != this) {
    ON_SurfaceProxy::operator=(&this->super_ON_SurfaceProxy,&src->super_ON_SurfaceProxy);
    this->m_face_user = src->m_face_user;
    this->m_status = src->m_status;
    this->m_face_index = src->m_face_index;
    ON_SimpleArray<int>::operator=(&this->m_li,&src->m_li);
    this->m_si = src->m_si;
    this->m_bRev = src->m_bRev;
    this->m_face_material_channel = src->m_face_material_channel;
    uVar5 = (src->m_face_uuid).Data2;
    uVar6 = (src->m_face_uuid).Data3;
    uVar4 = *(undefined8 *)(src->m_face_uuid).Data4;
    (this->m_face_uuid).Data1 = (src->m_face_uuid).Data1;
    (this->m_face_uuid).Data2 = uVar5;
    (this->m_face_uuid).Data3 = uVar6;
    *(undefined8 *)(this->m_face_uuid).Data4 = uVar4;
    (this->m_per_face_color).field_0 = (src->m_per_face_color).field_0;
    __mutex = &this->m_pImpl->m_mesh_mutex;
    iVar7 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar7 != 0) {
      std::__throw_system_error(iVar7);
    }
    __mutex_00 = &src->m_pImpl->m_mesh_mutex;
    iVar7 = pthread_mutex_lock((pthread_mutex_t *)__mutex_00);
    if (iVar7 != 0) {
      std::__throw_system_error(iVar7);
    }
    peVar1 = (src->m_pImpl->m_render_mesh).
             super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 == (element_type *)0x0) ||
       (p_Var8 = (src->m_pImpl->m_render_mesh).
                 super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
       p_Var8 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
    }
    pIVar2 = this->m_pImpl;
    (pIVar2->m_render_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar1;
    p_Var3 = (pIVar2->m_render_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (pIVar2->m_render_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var8;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    peVar1 = (src->m_pImpl->m_analysis_mesh).
             super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 == (element_type *)0x0) ||
       (p_Var8 = (src->m_pImpl->m_analysis_mesh).
                 super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
       p_Var8 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
    }
    pIVar2 = this->m_pImpl;
    (pIVar2->m_analysis_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar1;
    p_Var3 = (pIVar2->m_analysis_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (pIVar2->m_analysis_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var8;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    peVar1 = (src->m_pImpl->m_preview_mesh).
             super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 == (element_type *)0x0) ||
       (p_Var8 = (src->m_pImpl->m_preview_mesh).
                 super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
       p_Var8 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
    }
    pIVar2 = this->m_pImpl;
    (pIVar2->m_preview_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar1;
    p_Var3 = (pIVar2->m_preview_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (pIVar2->m_preview_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var8;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex_00);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return this;
}

Assistant:

ON_BrepFace& ON_BrepFace::operator=(const ON_BrepFace& src)
{
  if ( &src != this ) 
  {
    // do not copy m_brep pointer
    ON_SurfaceProxy::operator=(src);
    m_face_user   = src.m_face_user;
    m_status      = src.m_status;
    m_face_index  = src.m_face_index;
    m_li    = src.m_li;
    m_si    = src.m_si;
    m_bRev  = src.m_bRev;
    m_face_material_channel = src.m_face_material_channel;
    m_face_uuid = src.m_face_uuid;
    m_per_face_color = src.m_per_face_color;

    std::lock_guard<std::recursive_mutex> lock(m_pImpl->m_mesh_mutex);
    std::lock_guard<std::recursive_mutex> lock2(src.m_pImpl->m_mesh_mutex);

    m_pImpl->m_render_mesh   = src.m_pImpl->m_render_mesh   ? src.m_pImpl->m_render_mesh   : nullptr;
    m_pImpl->m_analysis_mesh = src.m_pImpl->m_analysis_mesh ? src.m_pImpl->m_analysis_mesh : nullptr;
    m_pImpl->m_preview_mesh  = src.m_pImpl->m_preview_mesh  ? src.m_pImpl->m_preview_mesh  : nullptr;
  }
  return *this;
}